

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackDebGenerator.cxx
# Opt level: O2

int __thiscall cmCPackDebGenerator::PackageFiles(cmCPackDebGenerator *this)

{
  ComponentPackageMethod CVar1;
  cmCPackLog *this_00;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  char *local_1a8 [4];
  ostringstream cmCPackLog_msg;
  
  iVar3 = (*(this->super_cmCPackGenerator).super_cmObject._vptr_cmObject[0x18])();
  if ((char)iVar3 == '\0') {
    bVar2 = cmCPackGenerator::ReadListFile(&this->super_cmCPackGenerator,"CPackDeb.cmake");
    if (bVar2) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(&this->packageFiles,&(this->super_cmCPackGenerator).files);
      iVar3 = createDeb(this);
      return iVar3;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
    poVar4 = std::operator<<((ostream *)&cmCPackLog_msg,"Error while execution CPackDeb.cmake");
    std::endl<char,std::char_traits<char>>(poVar4);
    this_00 = (this->super_cmCPackGenerator).Logger;
    std::__cxx11::stringbuf::str();
    cmCPackLog::Log(this_00,0x10,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/cmCPackDebGenerator.cxx"
                    ,0x110,local_1a8[0]);
    std::__cxx11::string::~string((string *)local_1a8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
    return 0;
  }
  CVar1 = (this->super_cmCPackGenerator).componentPackageMethod;
  if (CVar1 != ONE_PACKAGE) {
    iVar3 = PackageComponents(this,CVar1 == ONE_PACKAGE_PER_COMPONENT);
    return iVar3;
  }
  iVar3 = PackageComponentsAllInOne(this);
  return iVar3;
}

Assistant:

int cmCPackDebGenerator::PackageFiles()
{
  int retval = -1;

  /* Are we in the component packaging case */
  if (WantsComponentInstallation()) {
    // CASE 1 : COMPONENT ALL-IN-ONE package
    // If ALL GROUPS or ALL COMPONENTS in ONE package has been requested
    // then the package file is unique and should be open here.
    if (componentPackageMethod == ONE_PACKAGE)
      {
      return PackageComponentsAllInOne();
      }
    // CASE 2 : COMPONENT CLASSICAL package(s) (i.e. not all-in-one)
    // There will be 1 package for each component group
    // however one may require to ignore component group and
    // in this case you'll get 1 package for each component.
    else
      {
      return PackageComponents(componentPackageMethod ==
                               ONE_PACKAGE_PER_COMPONENT);
      }
  }
  // CASE 3 : NON COMPONENT package.
  else
    {
    if (!this->ReadListFile("CPackDeb.cmake"))
      {
      cmCPackLogger(cmCPackLog::LOG_ERROR,
                    "Error while execution CPackDeb.cmake" << std::endl);
      retval = 0;
      }
    else
      {
      packageFiles = files;
      return createDeb();
      }
    }
  return retval;
}